

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O1

uint32_t helper_qadd8_aarch64(uint32_t a,uint32_t b)

{
  uint uVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  
  uVar7 = b + a & 0xff;
  uVar4 = (uint)(byte)(((byte)(a >> 7) & 1) + 0x7f);
  if (-1 < (char)((byte)(b + a) ^ (byte)a)) {
    uVar4 = uVar7;
  }
  if ((char)((byte)b ^ (byte)a) < '\0') {
    uVar4 = uVar7;
  }
  uVar7 = (b >> 8) + (a >> 8);
  bVar2 = (byte)(a >> 8);
  uVar3 = (uint)(byte)(0x7f - ((char)bVar2 >> 7));
  if (-1 < (char)((byte)uVar7 ^ bVar2)) {
    uVar3 = uVar7 & 0xff;
  }
  if ((char)((byte)(b >> 8) ^ bVar2) < '\0') {
    uVar3 = uVar7 & 0xff;
  }
  uVar7 = (b >> 0x10) + (a >> 0x10);
  bVar2 = (byte)(a >> 0x10);
  uVar5 = (uint)(byte)(0x7f - ((char)bVar2 >> 7));
  if (-1 < (char)((byte)uVar7 ^ bVar2)) {
    uVar5 = uVar7 & 0xff;
  }
  if ((char)((byte)(b >> 0x10) ^ bVar2) < '\0') {
    uVar5 = uVar7 & 0xff;
  }
  uVar7 = (b >> 0x18) + (a >> 0x18);
  uVar6 = uVar7 & 0xff;
  bVar2 = (byte)(a >> 0x18);
  uVar1 = (uint)(byte)(0x80 - (-1 < (int)a));
  if (-1 < (char)((byte)uVar7 ^ bVar2)) {
    uVar1 = uVar6;
  }
  if ((char)((byte)(b >> 0x18) ^ bVar2) < '\0') {
    uVar1 = uVar6;
  }
  return uVar1 << 0x18 | uVar5 << 0x10 | uVar3 << 8 | uVar4;
}

Assistant:

static inline uint8_t add8_sat(uint8_t a, uint8_t b)
{
    uint8_t res;

    res = a + b;
    if (((res ^ a) & 0x80) && !((a ^ b) & 0x80)) {
        if (a & 0x80)
            res = 0x80;
        else
            res = 0x7f;
    }
    return res;
}